

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SequenceFeatureType::SerializeWithCachedSizes
          (SequenceFeatureType *this,CodedOutputStream *output)

{
  uint32 uVar1;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&((this->Type_).int64type_)->super_MessageLite,output);
    uVar1 = this->_oneof_case_[0];
  }
  if (uVar1 == 3) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&((this->Type_).int64type_)->super_MessageLite,output);
  }
  if (this->sizerange_ != (SizeRange *)0x0 &&
      this != (SequenceFeatureType *)&_SequenceFeatureType_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x65,&this->sizerange_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void SequenceFeatureType::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SequenceFeatureType)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Int64FeatureType int64Type = 1;
  if (has_int64type()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *Type_.int64type_, output);
  }

  // .CoreML.Specification.StringFeatureType stringType = 3;
  if (has_stringtype()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *Type_.stringtype_, output);
  }

  // .CoreML.Specification.SizeRange sizeRange = 101;
  if (this->has_sizerange()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      101, *this->sizerange_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SequenceFeatureType)
}